

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O0

void __thiscall Thread::~Thread(Thread *this)

{
  Thread *this_local;
  
  this->_vptr_Thread = (_func_int **)&PTR__Thread_00302630;
  if ((this->mRunning & 1U) != 0) {
    pthread_cancel(this->mThread);
  }
  std::weak_ptr<EventLoop>::~weak_ptr(&this->mLoop);
  return;
}

Assistant:

Thread::~Thread()
{
    if (mRunning)
        pthread_cancel(mThread);
}